

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedNormalizer.cpp
# Opt level: O0

bool __thiscall Shell::InterpretedNormalizer::apply(InterpretedNormalizer *this,UnitList **units)

{
  bool bVar1;
  undefined1 uVar2;
  Clause *this_00;
  Clause *pCVar3;
  List<Kernel::Unit_*> **in_RSI;
  FormulaUnit *fu1;
  FormulaUnit *fu;
  Clause *cl1;
  Clause *cl;
  Unit *u;
  DelIterator uit;
  bool modified;
  FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> futransf;
  NFormulaTransformer ftransf;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  byte bVar4;
  Clause *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  InferenceRule rule;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  FormulaUnit *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Clause *in_stack_ffffffffffffffd0;
  InterpretedNormalizer *in_stack_ffffffffffffffd8;
  
  rule = (InferenceRule)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  NFormulaTransformer::NFormulaTransformer
            ((NFormulaTransformer *)in_stack_ffffffffffffff40,
             (NLiteralTransformer *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  Kernel::FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer>::
  FTFormulaUnitTransformer
            ((FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),rule,
             (NFormulaTransformer *)in_stack_ffffffffffffff40);
  in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
  Lib::List<Kernel::Unit_*>::DelIterator::DelIterator
            ((DelIterator *)&stack0xffffffffffffffa0,in_RSI);
  while (bVar1 = Lib::List<Kernel::Unit_*>::DelIterator::hasNext
                           ((DelIterator *)
                            CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)), bVar1) {
    this_00 = (Clause *)
              Lib::List<Kernel::Unit_*>::DelIterator::next((DelIterator *)in_stack_ffffffffffffff40)
    ;
    uVar2 = Kernel::Unit::isClause((Unit *)this_00);
    if ((bool)uVar2) {
      pCVar3 = apply(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (this_00 != pCVar3) {
        if (pCVar3 == (Clause *)0x0) {
          Lib::List<Kernel::Unit_*>::DelIterator::del
                    ((DelIterator *)CONCAT17(uVar2,in_stack_ffffffffffffff50));
        }
        else {
          Lib::List<Kernel::Unit_*>::DelIterator::replace
                    ((DelIterator *)in_stack_ffffffffffffff40,
                     (Unit *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        }
        in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
      }
    }
    else {
      in_stack_ffffffffffffff40 =
           (Clause *)
           Kernel::LocalFormulaUnitTransformer::transform
                     ((LocalFormulaUnitTransformer *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0);
      if (this_00 != in_stack_ffffffffffffff40) {
        Lib::List<Kernel::Unit_*>::DelIterator::replace
                  ((DelIterator *)in_stack_ffffffffffffff40,
                   (Unit *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        in_stack_ffffffffffffffb8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb8);
      }
    }
  }
  bVar4 = (byte)(in_stack_ffffffffffffffb8 >> 0x18);
  Kernel::FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer>::
  ~FTFormulaUnitTransformer
            ((FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> *)0xbbd6fe
            );
  NFormulaTransformer::~NFormulaTransformer((NFormulaTransformer *)0xbbd70b);
  return (bool)(bVar4 & 1);
}

Assistant:

bool InterpretedNormalizer::apply(UnitList*& units)
{
  NFormulaTransformer ftransf(_litTransf);
  FTFormulaUnitTransformer<NFormulaTransformer> futransf(InferenceRule::THEORY_NORMALIZATION, ftransf);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      Clause* cl = static_cast<Clause*>(u);
      Clause* cl1 = apply(cl);
      if(cl!=cl1) {
	if(cl1) {
	  uit.replace(cl1);
	}
	else {
	  uit.del();
	}
	modified = true;
      }
    }
    else {
      FormulaUnit* fu = static_cast<FormulaUnit*>(u);
      FormulaUnit* fu1 = futransf.transform(fu);
      if(fu!=fu1) {
	      uit.replace(fu1);
	      modified = true;
      }
    }
  }
  return modified;
}